

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void __thiscall QList<QMimeType>::reserve(QList<QMimeType> *this,qsizetype asize)

{
  QMimeType *pQVar1;
  uint uVar2;
  Data *pDVar3;
  QMimeType *pQVar4;
  long lVar5;
  QArrayData *pQVar6;
  QMimeType *data;
  QMimeType *other;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<QMimeType> local_48;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->d).d;
  if ((pDVar3 != (Data *)0x0) &&
     (asize <= (pDVar3->super_QArrayData).alloc -
               ((long)((long)(this->d).ptr -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3))) {
    uVar2 = (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
            super_QFlagsStorage<QArrayData::ArrayOption>.i;
    if ((uVar2 & 1) != 0) goto LAB_004a3cdf;
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 1) {
      (pDVar3->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
      super_QFlagsStorage<QArrayData::ArrayOption>.i = uVar2 | 1;
      goto LAB_004a3cdf;
    }
  }
  lVar5 = (this->d).size;
  if (asize < lVar5) {
    asize = lVar5;
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = (QMimeType *)QArrayData::allocate(&local_30,8,0x10,asize,KeepSize);
  local_48.d = (Data *)local_30;
  local_48.size = 0;
  lVar5 = (this->d).size;
  local_48.ptr = pQVar4;
  if (lVar5 < 1) {
    lVar5 = 0;
    pQVar6 = local_30;
  }
  else {
    other = (this->d).ptr;
    pQVar1 = other + lVar5;
    do {
      QMimeType::QMimeType(pQVar4 + local_48.size,other);
      other = other + 1;
      lVar5 = local_48.size + 1;
      pQVar6 = &(local_48.d)->super_QArrayData;
      local_48.size = lVar5;
    } while (other < pQVar1);
  }
  if (pQVar6 != (QArrayData *)0x0) {
    *(byte *)&(pQVar6->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pQVar6->flags).super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  local_48.d = (this->d).d;
  pQVar4 = (this->d).ptr;
  (this->d).d = (Data *)pQVar6;
  (this->d).ptr = local_48.ptr;
  local_48.size = (this->d).size;
  (this->d).size = lVar5;
  local_48.ptr = pQVar4;
  QArrayDataPointer<QMimeType>::~QArrayDataPointer(&local_48);
LAB_004a3cdf:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}